

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_util.cpp
# Opt level: O3

bool duckdb::ArrowUtil::TryFetchChunk
               (ChunkScanState *scan_state,ClientProperties *options,idx_t batch_size,
               ArrowArray *out,idx_t *count,ErrorData *error,
               unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
               *extension_type_cast)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ExceptionType EVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  idx_t iVar6;
  DataChunk *pDVar7;
  idx_t iVar8;
  idx_t iVar9;
  ulong uVar10;
  ErrorData *pEVar11;
  long lVar12;
  ArrowArray *pAVar13;
  byte bVar14;
  ArrowAppender appender;
  vector<duckdb::LogicalType,_true> local_168;
  ClientProperties local_150;
  ArrowAppender local_120;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  ArrowArray local_80;
  undefined4 extraout_var_00;
  
  bVar14 = 0;
  *count = 0;
  iVar5 = (*scan_state->_vptr_ChunkScanState[5])();
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_168,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             CONCAT44(extraout_var,iVar5));
  paVar2 = &local_150.time_zone.field_2;
  local_150.time_zone._M_dataplus._M_p = (options->time_zone)._M_dataplus._M_p;
  paVar1 = &(options->time_zone).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.time_zone._M_dataplus._M_p == paVar1) {
    local_150.time_zone.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_150.time_zone.field_2._8_8_ = *(undefined8 *)((long)&(options->time_zone).field_2 + 8);
    local_150.time_zone._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.time_zone.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_150.time_zone._M_string_length = (options->time_zone)._M_string_length;
  (options->time_zone)._M_dataplus._M_p = (pointer)paVar1;
  (options->time_zone)._M_string_length = 0;
  (options->time_zone).field_2._M_local_buf[0] = '\0';
  local_150.arrow_offset_size = options->arrow_offset_size;
  local_150.arrow_use_list_view = options->arrow_use_list_view;
  local_150.produce_arrow_string_view = options->produce_arrow_string_view;
  local_150.arrow_lossless_conversion = options->arrow_lossless_conversion;
  local_150._36_4_ = *(undefined4 *)&options->field_0x24;
  local_150.client_context.ptr._0_4_ = *(undefined4 *)&(options->client_context).ptr;
  local_150.client_context.ptr._4_4_ = *(undefined4 *)((long)&(options->client_context).ptr + 4);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_b8,extension_type_cast);
  ArrowAppender::ArrowAppender
            (&local_120,&local_168,batch_size,&local_150,
             (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
              *)&local_b8);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.time_zone._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.time_zone._M_dataplus._M_p);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_168);
  iVar6 = ChunkScanState::RemainingInChunk(scan_state);
  if (iVar6 != 0) {
    if (batch_size <= iVar6) {
      iVar6 = batch_size;
    }
    *count = *count + iVar6;
    pDVar7 = ChunkScanState::CurrentChunk(scan_state);
    iVar8 = ChunkScanState::CurrentOffset(scan_state);
    iVar9 = ChunkScanState::CurrentOffset(scan_state);
    ArrowAppender::Append(&local_120,pDVar7,iVar8,iVar9 + iVar6,pDVar7->count);
    ChunkScanState::IncreaseOffset(scan_state,iVar6,false);
  }
  uVar10 = *count;
  if (uVar10 < batch_size) {
    do {
      iVar5 = (*scan_state->_vptr_ChunkScanState[2])(scan_state,error);
      if ((char)iVar5 == '\0') {
        iVar5 = (*scan_state->_vptr_ChunkScanState[3])(scan_state);
        if ((char)iVar5 != '\0') {
          iVar5 = (*scan_state->_vptr_ChunkScanState[4])(scan_state);
          pEVar11 = (ErrorData *)CONCAT44(extraout_var_00,iVar5);
          EVar3 = pEVar11->type;
          error->initialized = pEVar11->initialized;
          error->type = EVar3;
          ::std::__cxx11::string::_M_assign((string *)&error->raw_message);
          ::std::__cxx11::string::_M_assign((string *)&error->final_message);
          if (pEVar11 != error) {
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&error->extra_info,&(pEVar11->extra_info)._M_h);
          }
        }
        bVar4 = false;
        goto LAB_00aa35d5;
      }
      bVar4 = ChunkScanState::ChunkIsEmpty(scan_state);
      if (bVar4) {
LAB_00aa35a3:
        uVar10 = *count;
        goto LAB_00aa35a7;
      }
      pDVar7 = ChunkScanState::CurrentChunk(scan_state);
      bVar4 = ChunkScanState::Finished(scan_state);
      if ((bVar4) || (pDVar7->count == 0)) goto LAB_00aa35a3;
      iVar6 = *count;
      iVar8 = ChunkScanState::RemainingInChunk(scan_state);
      uVar10 = batch_size - iVar6;
      if (iVar8 <= batch_size - iVar6) {
        uVar10 = iVar8;
      }
      ArrowAppender::Append(&local_120,pDVar7,0,uVar10,pDVar7->count);
      *count = *count + uVar10;
      ChunkScanState::IncreaseOffset(scan_state,uVar10,false);
    } while (*count < batch_size);
  }
  else {
LAB_00aa35a7:
    if (uVar10 == 0) goto LAB_00aa35d3;
  }
  ArrowAppender::Finalize(&local_80,&local_120);
  pAVar13 = &local_80;
  for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
    out->length = pAVar13->length;
    pAVar13 = (ArrowArray *)((long)pAVar13 + ((ulong)bVar14 * -2 + 1) * 8);
    out = (ArrowArray *)((long)out + (ulong)bVar14 * -0x10 + 8);
  }
LAB_00aa35d3:
  bVar4 = true;
LAB_00aa35d5:
  ArrowAppender::~ArrowAppender(&local_120);
  return bVar4;
}

Assistant:

bool ArrowUtil::TryFetchChunk(ChunkScanState &scan_state, ClientProperties options, idx_t batch_size, ArrowArray *out,
                              idx_t &count, ErrorData &error,
                              unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> extension_type_cast) {
	count = 0;
	ArrowAppender appender(scan_state.Types(), batch_size, std::move(options), std::move(extension_type_cast));
	const auto remaining_tuples_in_chunk = scan_state.RemainingInChunk();
	if (remaining_tuples_in_chunk) {
		// We start by scanning the non-finished current chunk
		idx_t cur_consumption = MinValue(remaining_tuples_in_chunk, batch_size);
		count += cur_consumption;
		auto &current_chunk = scan_state.CurrentChunk();
		appender.Append(current_chunk, scan_state.CurrentOffset(), scan_state.CurrentOffset() + cur_consumption,
		                current_chunk.size());
		scan_state.IncreaseOffset(cur_consumption);
	}
	while (count < batch_size) {
		if (!scan_state.LoadNextChunk(error)) {
			if (scan_state.HasError()) {
				error = scan_state.GetError();
			}
			return false;
		}
		if (scan_state.ChunkIsEmpty()) {
			// The scan was successful, but an empty chunk was returned
			break;
		}
		auto &current_chunk = scan_state.CurrentChunk();
		if (scan_state.Finished() || current_chunk.size() == 0) {
			break;
		}
		// The amount we still need to append into this chunk
		auto remaining = batch_size - count;

		// The amount remaining, capped by the amount left in the current chunk
		auto to_append_to_batch = MinValue(remaining, scan_state.RemainingInChunk());
		appender.Append(current_chunk, 0, to_append_to_batch, current_chunk.size());
		count += to_append_to_batch;
		scan_state.IncreaseOffset(to_append_to_batch);
	}
	if (count > 0) {
		*out = appender.Finalize();
	}
	return true;
}